

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryBefore(Normalizer2Impl *this,UChar *src,UChar *limit)

{
  UChar UVar1;
  uint uVar2;
  int c_00;
  int local_44;
  int local_34;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  if ((src == limit) || ((ushort)*src < (ushort)this->minCompNoMaybeCP)) {
    this_local._7_1_ = '\x01';
  }
  else {
    uVar2 = (uint)(ushort)*src;
    if ((uVar2 & 0xfffff800) == 0xd800) {
      if ((((*src & 0x400U) == 0) && (src + 1 != limit)) &&
         (UVar1 = src[1], (UVar1 & 0xfc00U) == 0xdc00)) {
        c_00 = uVar2 * 0x400 + (uint)(ushort)UVar1 + -0x35fdc00;
        if (c_00 < this->normTrie->highStart) {
          local_44 = ucptrie_internalSmallIndex_63(this->normTrie,c_00);
        }
        else {
          local_44 = this->normTrie->dataLength + -2;
        }
        local_34 = local_44;
      }
      else {
        local_34 = this->normTrie->dataLength + -1;
      }
    }
    else {
      local_34 = (uint)this->normTrie->index[(int)uVar2 >> 6] + (uVar2 & 0x3f);
    }
    this_local._7_1_ =
         norm16HasCompBoundaryBefore
                   (this,*(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_34 * 2));
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryBefore(const UChar *src, const UChar *limit) const {
    if (src == limit || *src < minCompNoMaybeCP) {
        return TRUE;
    }
    UChar32 c;
    uint16_t norm16;
    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
    return norm16HasCompBoundaryBefore(norm16);
}